

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_MNSV_UnexistingDomainResolveFails_Test::TestBody
          (InterpreterTestSuite_MNSV_UnexistingDomainResolveFails_Test *this)

{
  _func_int **pp_Var1;
  size_type sVar2;
  bool bVar3;
  char *pcVar4;
  char *expected_predicate_value;
  Status local_44a;
  Status local_449;
  string local_448;
  string local_428;
  string local_408;
  State local_3dc;
  Expression ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  internal local_390 [8];
  undefined8 *local_388;
  string local_380;
  UnixTime local_360;
  ByteArray local_358;
  ByteArray local_338;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [56];
  char local_2a0 [320];
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"127.0.0.1","");
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_3dc,0,0,0,0,0);
  ret.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ret.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"net1","");
  nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nids,"");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"");
  local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"domain1","");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  pcVar4 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"","");
  ot::commissioner::UnixTime::UnixTime(&local_360,0);
  expected_predicate_value = (char *)(ulong)(uint)local_3dc;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_2d8,&local_448,0x4e21,&local_338,&local_408,local_3dc,
             (string *)&ret,1,(string *)&nids,&local_428,(Timestamp)0x0,0,&local_380,&local_358,
             &local_2f8,'\0',0,&local_318,local_360,0x103f);
  local_449 = ot::commissioner::persistent_storage::Registry::Add
                        (ctx.mRegistry,(BorderAgent *)local_2d8);
  local_44a = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            (local_390,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_449,&local_44a);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  if ((pointer *)
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&ret.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(ret.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (local_388 != (undefined8 *)0x0) {
      pcVar4 = (char *)*local_388;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_448,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x16b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_448,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
    if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_2d8._0_8_ + 8))();
    }
    if (local_388 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_388 != local_388 + 2) {
        operator_delete((undefined8 *)*local_388);
      }
      operator_delete(local_388);
    }
  }
  else {
    if (local_388 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_388 != local_388 + 2) {
        operator_delete((undefined8 *)*local_388);
      }
      operator_delete(local_388);
    }
    local_408.field_2._M_allocated_capacity = 0;
    local_408._M_dataplus._M_p = (pointer)0x0;
    local_408._M_string_length = 0;
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pp_Var1 = (_func_int **)(local_2d8 + 0x10);
    local_2d8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"start --dom domain2","");
    ot::commissioner::Interpreter::ParseExpression
              ((Expression *)&local_428,&ctx.mInterpreter,(string *)local_2d8);
    local_448.field_2._M_allocated_capacity = local_408.field_2._M_allocated_capacity;
    local_448._M_string_length = local_408._M_string_length;
    local_448._M_dataplus._M_p = local_408._M_dataplus._M_p;
    local_408.field_2._M_allocated_capacity = local_428.field_2._M_allocated_capacity;
    local_408._M_dataplus._M_p = local_428._M_dataplus._M_p;
    local_408._M_string_length = local_428._M_string_length;
    local_428._M_dataplus._M_p = (pointer)0x0;
    local_428._M_string_length = 0;
    local_428.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_448);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_428);
    if ((_func_int **)local_2d8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2d8._0_8_);
    }
    ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
              ((Error *)local_2d8,&ctx.mInterpreter,(Expression *)&local_408,&ret);
    local_428._M_dataplus._M_p._0_4_ = local_2d8._0_4_;
    local_380._M_dataplus._M_p = local_380._M_dataplus._M_p & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
              ((internal *)&local_448,
               "ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode()","ErrorCode::kNone",
               (ErrorCode *)&local_428,(ErrorCode *)&local_380);
    if ((undefined1 *)local_2d8._8_8_ != local_2d8 + 0x18) {
      operator_delete((void *)local_2d8._8_8_);
    }
    if ((char)local_448._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)local_2d8);
      if ((undefined8 *)local_448._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_448._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x170,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_428,(Message *)local_2d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
      if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_2d8._0_8_ + 8))();
      }
    }
    sVar2 = local_448._M_string_length;
    if ((undefined8 *)local_448._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_448._M_string_length !=
          (undefined8 *)(local_448._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_448._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
              ((Value *)local_2d8,&ctx.mInterpreter,&ret,&nids);
    bVar3 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_2d8);
    local_448._M_dataplus._M_p._0_1_ = !bVar3;
    local_448._M_string_length = 0;
    if ((char *)local_2d8._40_8_ != local_2a0) {
      operator_delete((void *)local_2d8._40_8_);
    }
    if ((undefined1 *)local_2d8._8_8_ != local_2d8 + 0x18) {
      operator_delete((void *)local_2d8._8_8_);
    }
    if ((char)local_448._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_428);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2d8,(internal *)&local_448,
                 (AssertionResult *)
                 "ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError()","true",
                 "false",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_380,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x171,(char *)local_2d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&local_428);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
      if ((_func_int **)local_2d8._0_8_ != pp_Var1) {
        operator_delete((void *)local_2d8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_428._M_dataplus._M_p + 8))();
      }
    }
    sVar2 = local_448._M_string_length;
    if ((undefined8 *)local_448._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_448._M_string_length !=
          (undefined8 *)(local_448._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_448._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    if (nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ret);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_408);
  }
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_UnexistingDomainResolveFails)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --dom domain2");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_FALSE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
}